

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Select.hpp
# Opt level: O2

Gen<char> * __thiscall
rc::gen::oneOf<char,char,char>
          (Gen<char> *__return_storage_ptr__,gen *this,Gen<char> *gen,Gen<char> *gens,
          Gen<char> *gens_1)

{
  OneOfGen<char> OStack_b8;
  Gen<char> local_a0;
  Gen<char> local_78;
  Gen<char> local_50;
  
  Gen<char>::Gen(&local_50,(Gen<char> *)this);
  Gen<char>::Gen(&local_78,gen);
  Gen<char>::Gen(&local_a0,gens);
  detail::OneOfGen<char>::OneOfGen<char,char,char>(&OStack_b8,&local_50,&local_78,&local_a0);
  Gen<char>::Gen<rc::gen::detail::OneOfGen<char>,void>(__return_storage_ptr__,&OStack_b8);
  std::vector<rc::Gen<char>,_std::allocator<rc::Gen<char>_>_>::~vector(&OStack_b8.m_gens);
  Gen<char>::~Gen(&local_a0);
  Gen<char>::~Gen(&local_78);
  Gen<char>::~Gen(&local_50);
  return __return_storage_ptr__;
}

Assistant:

Gen<T> oneOf(Gen<T> gen, Gen<Ts>... gens) {
  return detail::OneOfGen<T>(std::move(gen), std::move(gens)...);
}